

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O3

int32_t __thiscall
icu_63::JapaneseCalendar::getDefaultDayInMonth(JapaneseCalendar *this,int32_t eyear,int32_t month)

{
  int eraIdx;
  int32_t iVar1;
  int32_t eraStart [3];
  UErrorCode status;
  int local_28 [2];
  int32_t local_20;
  UErrorCode local_1c;
  
  eraIdx = (*(this->super_GregorianCalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  local_20 = 0;
  local_28[0] = 0;
  local_28[1] = 0;
  local_1c = U_ZERO_ERROR;
  EraRules::getStartDate(gJapaneseEraRules,eraIdx,(int32_t (*) [3])local_28,&local_1c);
  iVar1 = 1;
  if ((local_28[0] == eyear) && (local_28[1] + -1 == month)) {
    iVar1 = local_20;
  }
  return iVar1;
}

Assistant:

int32_t JapaneseCalendar::getDefaultDayInMonth(int32_t eyear, int32_t month) 
{
    int32_t era = internalGetEra();
    int32_t day = 1;

    int32_t eraStart[3] = { 0,0,0 };
    UErrorCode status = U_ZERO_ERROR;
    gJapaneseEraRules->getStartDate(era, eraStart, status);
    U_ASSERT(U_SUCCESS(status));
    if(eyear == eraStart[0]) {
        if(month == eraStart[1] - 1) {
            return eraStart[2];
        }
    }

    return day;
}